

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokFileDesc::enum_source_lines
          (CTcTokFileDesc *this,_func_void_void_ptr_ulong_ulong *cbfunc,void *cbctx)

{
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  ulong *p;
  ulong linenum;
  size_t i;
  CTcTokSrcPage **pg;
  size_t page_idx;
  long *local_40;
  long local_38;
  ulong local_30;
  long *local_28;
  ulong local_20;
  
  local_20 = 0;
  local_28 = *(long **)(in_RDI + 0x48);
  for (; local_20 < *(ulong *)(in_RDI + 0x50); local_20 = local_20 + 1) {
    if (*local_28 != 0) {
      local_38 = local_20 << 10;
      local_30 = 0;
      local_40 = (long *)*local_28;
      for (; local_30 < 0x400; local_30 = local_30 + 1) {
        if (*local_40 != 0) {
          (*in_RSI)(in_RDX,local_38,*local_40);
        }
        local_40 = local_40 + 1;
        local_38 = local_38 + 1;
      }
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CTcTokFileDesc::enum_source_lines(void (*cbfunc)(void *, ulong, ulong),
                                       void *cbctx)
{
    size_t page_idx;
    CTcTokSrcPage **pg;

    /* loop over all of the pages */
    for (page_idx = 0, pg = src_pages_ ; page_idx < src_pages_alo_ ;
         ++page_idx, ++pg)
    {
        size_t i;
        ulong linenum;
        ulong *p;

        /* if this page is not populated, skip it */
        if (*pg == 0)
            continue;

        /* calculate the starting line number for this page */
        linenum = page_idx * TCTOK_SRC_PAGE_CNT;
        
        /* loop over the entries on this page */
        for (i = 0, p = (*pg)->ofs ; i < TCTOK_SRC_PAGE_CNT ;
             ++i, ++p, ++linenum)
        {
            /* if this entry has been set, call the callback */
            if (*p != 0)
                (*cbfunc)(cbctx, linenum, *p);
        }
    }
}